

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualMatch.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::EqualMatch::match(EqualMatch *this,shared_ptr<const_oout::Text> *in)

{
  element_type *peVar1;
  ostream *poVar2;
  __shared_ptr_access<const_oout::Text,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  string local_208 [39];
  undefined1 local_1e1 [17];
  undefined1 local_1d0 [32];
  ostringstream message;
  undefined1 local_40 [8];
  string origin;
  shared_ptr<const_oout::Text> *in_local;
  EqualMatch *this_local;
  
  peVar1 = std::__shared_ptr_access<const_oout::Text,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  (*peVar1->_vptr_Text[2])(local_40);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 0x18));
  poVar2 = std::operator<<((ostream *)(local_1d0 + 0x18),"\'");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,"\' is equal \'");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(in->
                                   super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_refcount);
  std::operator<<(poVar2,"\'");
  local_1e1[0] = (_Alloc_hider)
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(in->
                                     super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount);
  std::__cxx11::ostringstream::str();
  std::make_shared<oout::CondResult,bool,std::__cxx11::string>
            ((bool *)(local_1e1 + 1),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e1);
  std::make_unique<oout::TestResult,std::shared_ptr<oout::CondResult>>
            ((shared_ptr<oout::CondResult> *)local_1d0);
  std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>::
  unique_ptr<oout::TestResult,std::default_delete<oout::TestResult>,void>
            ((unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>> *)this,
             (unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1d0);
  std::unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_>::~unique_ptr
            ((unique_ptr<oout::TestResult,_std::default_delete<oout::TestResult>_> *)local_1d0);
  std::shared_ptr<oout::CondResult>::~shared_ptr((shared_ptr<oout::CondResult> *)(local_1e1 + 1));
  std::__cxx11::string::~string(local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1d0 + 0x18));
  std::__cxx11::string::~string((string *)local_40);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> EqualMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' is equal '" << text << "'";
	return make_unique<TestResult>(
		make_shared<CondResult>(origin == text, message.str())
	);
}